

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_version_parsing_simple03_Test::TestBody(http_version_parsing_simple03_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  Message local_58 [3];
  http_version local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  undefined1 auStack_20 [4];
  http_version version;
  sub_string str;
  http_version_parsing_simple03_Test *this_local;
  
  str.end_ = (char *)this;
  _auStack_20 = sub_string::literal<9ul>((char (*) [9])"HTTP/1.1");
  gtest_ar.message_.ptr_._4_4_ = parse_version((sub_string *)auStack_20);
  local_3c = HTTP_11;
  testing::internal::EqHelper<false>::Compare<http_version,http_version>
            ((EqHelper<false> *)local_38,"version","http_version::HTTP_11",
             (http_version *)((long)&gtest_ar.message_.ptr_ + 4),&local_3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  bVar1 = sub_string::empty((sub_string *)auStack_20);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_70,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_70,(AssertionResult *)0x1870b9,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST(http_version_parsing, simple03)
{
    sub_string str = sub_string::literal("HTTP/1.1");
    http_version version = parse_version(str);
    EXPECT_EQ(version, http_version::HTTP_11);
    EXPECT_TRUE(str.empty());
}